

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  U32 *pUVar2;
  seqDef *psVar3;
  bool bVar4;
  char cVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  BYTE *pBVar11;
  byte bVar12;
  U32 UVar13;
  BYTE *pBVar14;
  int *piVar15;
  BYTE *pBVar16;
  long lVar17;
  U32 UVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int *piVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  seqStore_t *psVar26;
  U32 UVar27;
  U32 UVar28;
  uint uVar29;
  int *piVar30;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_e0;
  uint local_d4;
  int *local_d0;
  ulong local_c8;
  int local_c0;
  uint local_bc;
  BYTE *local_b8;
  int *local_b0;
  U32 local_a4;
  int *local_a0;
  ulong local_98;
  uint local_8c;
  int *local_88;
  undefined8 local_80;
  BYTE *local_78;
  BYTE *local_70;
  ulong local_68;
  int *local_60;
  seqStore_t *local_58;
  BYTE *local_50;
  int *local_48;
  U32 *local_40;
  ulong local_38;
  
  local_b8 = (ms->window).base;
  local_78 = (ms->window).dictBase;
  uVar23 = (ms->window).dictLimit;
  uVar10 = (ulong)uVar23;
  local_50 = (BYTE *)(ulong)(ms->window).lowLimit;
  uVar8 = (ms->cParams).windowLog;
  local_68 = CONCAT44(local_68._4_4_,uVar8);
  local_bc = (ms->cParams).minMatch;
  if (5 < local_bc) {
    local_bc = 6;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  local_8c = (ms->cParams).searchLog;
  local_d4 = 6;
  if (local_8c < 6) {
    local_d4 = local_8c;
  }
  if (local_d4 < 5) {
    local_d4 = 4;
  }
  UVar28 = *rep;
  UVar18 = rep[1];
  ms->lazySkipping = 0;
  local_70 = local_b8 + uVar10;
  local_c0 = CONCAT31(local_c0._1_3_,local_70 == (BYTE *)src);
  local_88 = (int *)((long)src + (srcSize - 0x10));
  uVar24 = ms->nextToUpdate;
  uVar21 = (ulong)uVar24;
  uVar20 = ((int)local_88 - (int)(local_b8 + uVar21)) + 1;
  uVar29 = 8;
  if (uVar20 < 8) {
    uVar29 = uVar20;
  }
  if (local_88 < local_b8 + uVar21) {
    uVar29 = 0;
  }
  bVar12 = (byte)local_d4;
  local_b0 = (int *)src;
  local_a4 = UVar18;
  local_98 = uVar10;
  local_58 = seqStore;
  local_40 = rep;
  if (uVar24 < uVar29 + uVar24) {
    local_d0 = (int *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_0017edc8:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar2 = ms->hashTable;
    pBVar14 = ms->tagTable;
    uVar19 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    local_80 = 0xcf1bbcdcbf9b0000;
    do {
      if (local_bc == 5) {
        uVar25 = *(long *)(local_b8 + uVar21) * -0x30e4432345000000;
LAB_0017dfe5:
        uVar25 = (uVar25 ^ uVar19) >> (0x38U - cVar5 & 0x3f);
      }
      else {
        if (local_bc == 6) {
          uVar25 = *(long *)(local_b8 + uVar21) * -0x30e4432340650000;
          goto LAB_0017dfe5;
        }
        uVar25 = (ulong)((*(int *)(local_b8 + uVar21) * -0x61c8864f ^ (uint)uVar19) >>
                        (0x18U - cVar5 & 0x1f));
      }
      uVar20 = ((uint)(uVar25 >> 8) & 0xffffff) << (bVar12 & 0x1f);
      if (((ulong)(pUVar2 + uVar20) & 0x3f) != 0) {
LAB_0017ecd0:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar14 + uVar20) & ~(-1L << (bVar12 & 0x3f))) != 0) {
LAB_0017ecb1:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar21 & 7] = (U32)uVar25;
      uVar21 = uVar21 + 1;
    } while (uVar29 + uVar24 != uVar21);
  }
  piVar22 = (int *)(srcSize + (long)src);
  piVar30 = (int *)((ulong)(local_70 == (BYTE *)src) + (long)src);
  if (piVar30 < local_88) {
    local_60 = (int *)(local_78 + uVar10);
    local_50 = local_50 + (long)local_78;
    local_80 = CONCAT44(local_80._4_4_,1 << ((byte)uVar8 & 0x1f));
    local_c0 = uVar23 - 1;
    local_48 = piVar22 + -8;
    local_38 = ~(-1L << (bVar12 & 0x3f));
    local_d0 = piVar22;
    do {
      uVar23 = (int)piVar30 - (int)local_b8;
      local_68 = (ulong)uVar23;
      iVar7 = uVar23 + 1;
      UVar27 = (ms->window).lowLimit;
      UVar13 = iVar7 - (uint)local_80;
      if (iVar7 - UVar27 <= (uint)local_80) {
        UVar13 = UVar27;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar27;
      }
      uVar8 = iVar7 - UVar28;
      pBVar14 = local_b8;
      if (uVar8 < (uint)uVar10) {
        pBVar14 = local_78;
      }
      if (local_c0 - uVar8 < 3) {
LAB_0017e196:
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if (UVar28 <= (uVar23 - UVar13) + 1) {
          if (*(int *)((long)piVar30 + 1) != *(int *)(pBVar14 + uVar8)) goto LAB_0017e196;
          piVar15 = piVar22;
          if (uVar8 < (uint)uVar10) {
            piVar15 = local_60;
          }
          sVar9 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar30 + 5),(BYTE *)((long)(pBVar14 + uVar8) + 4),
                             (BYTE *)piVar22,(BYTE *)piVar15,local_70);
          uVar21 = sVar9 + 4;
          piVar22 = local_d0;
        }
      }
      local_e0 = 999999999;
      local_a4 = UVar18;
      if (local_bc == 6) {
        if (local_d4 == 6) {
          uVar10 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
        }
        else if (local_d4 == 5) {
          uVar10 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
        }
      }
      else if (local_bc == 5) {
        if (local_d4 == 6) {
          uVar10 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
        }
        else if (local_d4 == 5) {
          uVar10 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
        }
      }
      else if (local_d4 == 6) {
        uVar10 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
      }
      else if (local_d4 == 5) {
        uVar10 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
      }
      else {
        uVar10 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)piVar30,(BYTE *)piVar22,&local_e0);
      }
      local_c8 = uVar21;
      if (uVar21 < uVar10) {
        local_c8 = uVar10;
      }
      if (local_c8 < 4) {
        uVar10 = (long)piVar30 - (long)local_b0;
        piVar30 = (int *)((long)piVar30 + (uVar10 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar10);
        piVar22 = local_d0;
        uVar10 = local_98;
        UVar18 = local_a4;
      }
      else {
        local_a0 = piVar30;
        uVar19 = local_e0;
        if (uVar10 <= uVar21) {
          local_a0 = (int *)((long)piVar30 + 1);
          uVar19 = 1;
        }
        uVar10 = local_68;
        if (piVar30 < local_88) {
          do {
            piVar22 = (int *)((long)piVar30 + 1);
            uVar23 = (int)uVar10 + 1;
            local_68 = uVar10;
            if (uVar19 == 0) {
              uVar19 = 0;
            }
            else {
              UVar18 = (ms->window).lowLimit;
              UVar27 = uVar23 - (uint)local_80;
              if (uVar23 - UVar18 <= (uint)local_80) {
                UVar27 = UVar18;
              }
              if (ms->loadedDictEnd != 0) {
                UVar27 = UVar18;
              }
              uVar8 = uVar23 - UVar28;
              pBVar14 = local_b8;
              if (uVar8 < (uint)local_98) {
                pBVar14 = local_78;
              }
              if (((2 < local_c0 - uVar8) && (UVar28 <= uVar23 - UVar27)) &&
                 (*piVar22 == *(int *)(pBVar14 + uVar8))) {
                piVar15 = local_d0;
                if (uVar8 < (uint)local_98) {
                  piVar15 = local_60;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar30 + 5),(BYTE *)((long)(pBVar14 + uVar8) + 4)
                                   ,(BYTE *)local_d0,(BYTE *)piVar15,local_70);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar8 = 0x1f;
                  if ((uint)uVar19 != 0) {
                    for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                    }
                  }
                  if ((int)((uVar8 ^ 0x1f) + (int)local_c8 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                    uVar19 = 1;
                    local_c8 = sVar9 + 4;
                    local_a0 = piVar22;
                  }
                }
              }
            }
            local_e0 = 999999999;
            if (local_bc == 6) {
              if (local_d4 == 6) {
                uVar10 = ZSTD_RowFindBestMatch_extDict_6_6
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
              else if (local_d4 == 5) {
                uVar10 = ZSTD_RowFindBestMatch_extDict_6_5
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
              else {
                uVar10 = ZSTD_RowFindBestMatch_extDict_6_4
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
            }
            else if (local_bc == 5) {
              if (local_d4 == 6) {
                uVar10 = ZSTD_RowFindBestMatch_extDict_5_6
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
              else if (local_d4 == 5) {
                uVar10 = ZSTD_RowFindBestMatch_extDict_5_5
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
              else {
                uVar10 = ZSTD_RowFindBestMatch_extDict_5_4
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
            }
            else if (local_d4 == 6) {
              uVar10 = ZSTD_RowFindBestMatch_extDict_4_6
                                 (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
            }
            else if (local_d4 == 5) {
              uVar10 = ZSTD_RowFindBestMatch_extDict_4_5
                                 (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
            }
            else {
              uVar10 = ZSTD_RowFindBestMatch_extDict_4_4
                                 (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
            }
            bVar4 = true;
            if (3 < uVar10) {
              uVar8 = 0x1f;
              if ((uint)uVar19 != 0) {
                for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              iVar7 = 0x1f;
              if ((uint)local_e0 != 0) {
                for (; (uint)local_e0 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                }
              }
              if ((int)((uVar8 ^ 0x1f) + (int)local_c8 * 4 + -0x1b) < (int)uVar10 * 4 - iVar7) {
                bVar4 = false;
                uVar19 = local_e0;
                local_c8 = uVar10;
                local_a0 = piVar22;
              }
            }
            if (bVar4) {
              if (local_88 <= piVar22) break;
              piVar22 = (int *)((long)piVar30 + 2);
              uVar23 = (int)local_68 + 2;
              if (uVar19 == 0) {
                uVar19 = 0;
              }
              else {
                UVar18 = (ms->window).lowLimit;
                UVar27 = uVar23 - (uint)local_80;
                if (uVar23 - UVar18 <= (uint)local_80) {
                  UVar27 = UVar18;
                }
                if (ms->loadedDictEnd != 0) {
                  UVar27 = UVar18;
                }
                uVar8 = uVar23 - UVar28;
                pBVar14 = local_b8;
                if (uVar8 < (uint)local_98) {
                  pBVar14 = local_78;
                }
                if (((2 < local_c0 - uVar8) && (UVar28 <= uVar23 - UVar27)) &&
                   (*piVar22 == *(int *)(pBVar14 + uVar8))) {
                  piVar15 = local_d0;
                  if (uVar8 < (uint)local_98) {
                    piVar15 = local_60;
                  }
                  sVar9 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar30 + 6),
                                     (BYTE *)((long)(pBVar14 + uVar8) + 4),(BYTE *)local_d0,
                                     (BYTE *)piVar15,local_70);
                  if (sVar9 < 0xfffffffffffffffc) {
                    uVar8 = 0x1f;
                    if ((uint)uVar19 != 0) {
                      for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                      }
                    }
                    if ((int)((uVar8 ^ 0x1f) + (int)local_c8 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                      uVar19 = 1;
                      local_c8 = sVar9 + 4;
                      local_a0 = piVar22;
                    }
                  }
                }
              }
              local_e0 = 999999999;
              if (local_bc == 6) {
                if (local_d4 == 6) {
                  uVar10 = ZSTD_RowFindBestMatch_extDict_6_6
                                     (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
                }
                else if (local_d4 == 5) {
                  uVar10 = ZSTD_RowFindBestMatch_extDict_6_5
                                     (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
                }
                else {
                  uVar10 = ZSTD_RowFindBestMatch_extDict_6_4
                                     (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
                }
              }
              else if (local_bc == 5) {
                if (local_d4 == 6) {
                  uVar10 = ZSTD_RowFindBestMatch_extDict_5_6
                                     (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
                }
                else if (local_d4 == 5) {
                  uVar10 = ZSTD_RowFindBestMatch_extDict_5_5
                                     (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
                }
                else {
                  uVar10 = ZSTD_RowFindBestMatch_extDict_5_4
                                     (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
                }
              }
              else if (local_d4 == 6) {
                uVar10 = ZSTD_RowFindBestMatch_extDict_4_6
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
              else if (local_d4 == 5) {
                uVar10 = ZSTD_RowFindBestMatch_extDict_4_5
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
              else {
                uVar10 = ZSTD_RowFindBestMatch_extDict_4_4
                                   (ms,(BYTE *)piVar22,(BYTE *)local_d0,&local_e0);
              }
              bVar4 = true;
              if (3 < uVar10) {
                uVar8 = 0x1f;
                if ((uint)uVar19 != 0) {
                  for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                iVar7 = 0x1f;
                if ((uint)local_e0 != 0) {
                  for (; (uint)local_e0 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                  }
                }
                if ((int)((uVar8 ^ 0x1f) + (int)local_c8 * 4 + -0x18) < (int)uVar10 * 4 - iVar7) {
                  bVar4 = false;
                  uVar19 = local_e0;
                  local_c8 = uVar10;
                  local_a0 = piVar22;
                }
              }
              if (bVar4) break;
            }
            uVar10 = (ulong)uVar23;
            piVar30 = piVar22;
          } while (piVar22 < local_88);
        }
        psVar26 = local_58;
        piVar22 = local_a0;
        UVar27 = UVar28;
        UVar18 = local_a4;
        if (3 < uVar19) {
          pBVar16 = (BYTE *)((long)local_a0 + (3 - (long)(local_b8 + uVar19)));
          pBVar11 = local_70;
          pBVar14 = local_b8;
          if ((uint)pBVar16 < (uint)local_98) {
            pBVar11 = local_50;
            pBVar14 = local_78;
          }
          if ((local_b0 < local_a0) &&
             (uVar10 = (ulong)pBVar16 & 0xffffffff, pBVar11 < pBVar14 + uVar10)) {
            pBVar14 = pBVar14 + uVar10;
            do {
              piVar30 = (int *)((long)piVar22 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar30 != *pBVar14) ||
                 (local_c8 = local_c8 + 1, piVar22 = piVar30, piVar30 <= local_b0)) break;
            } while (pBVar11 < pBVar14);
          }
          UVar27 = (U32)uVar19 - 3;
          UVar18 = UVar28;
        }
        if (local_58->maxNbSeq <=
            (ulong)((long)local_58->sequences - (long)local_58->sequencesStart >> 3)) {
LAB_0017ecef:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_58->maxNbLit) {
LAB_0017ed0e:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar10 = (long)piVar22 - (long)local_b0;
        pBVar14 = local_58->lit;
        if (local_58->litStart + local_58->maxNbLit < pBVar14 + uVar10) {
LAB_0017ed6b:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_d0 < piVar22) {
LAB_0017ed4c:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_a0 = piVar22;
        if (local_48 < piVar22) {
          ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_b0,(BYTE *)piVar22,(BYTE *)local_48);
        }
        else {
          uVar6 = *(undefined8 *)(local_b0 + 2);
          *(undefined8 *)pBVar14 = *(undefined8 *)local_b0;
          *(undefined8 *)(pBVar14 + 8) = uVar6;
          if (0x10 < uVar10) {
            pBVar14 = local_58->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar14 + 0x10 + (-0x10 - (long)(local_b0 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)(local_b0 + 6);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_b0 + 4);
            *(undefined8 *)(pBVar14 + 0x18) = uVar6;
            if (0x20 < (long)uVar10) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_b0 + lVar17 + 0x20);
                uVar6 = puVar1[1];
                pBVar11 = pBVar14 + lVar17 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)local_b0 + lVar17 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar6;
                lVar17 = lVar17 + 0x20;
              } while (pBVar11 + 0x20 < pBVar14 + uVar10);
            }
          }
        }
        psVar26->lit = psVar26->lit + uVar10;
        if (0xffff < uVar10) {
          if (psVar26->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar26->longLengthType = ZSTD_llt_literalLength;
          psVar26->longLengthPos =
               (U32)((ulong)((long)psVar26->sequences - (long)psVar26->sequencesStart) >> 3);
        }
        psVar3 = psVar26->sequences;
        psVar3->litLength = (U16)uVar10;
        psVar3->offBase = (U32)uVar19;
        if (local_c8 < 3) {
LAB_0017ed2d:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_c8 - 3) {
          if (psVar26->longLengthType != ZSTD_llt_none) {
LAB_0017ed8a:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar26->longLengthType = ZSTD_llt_matchLength;
          psVar26->longLengthPos = (U32)((ulong)((long)psVar3 - (long)psVar26->sequencesStart) >> 3)
          ;
        }
        psVar3->mlBase = (U16)(local_c8 - 3);
        psVar26->sequences = psVar3 + 1;
        if (ms->lazySkipping != 0) {
          uVar23 = ms->nextToUpdate;
          uVar10 = (ulong)uVar23;
          uVar8 = ((int)local_88 - (int)(local_b8 + uVar10)) + 1;
          if (7 < uVar8) {
            uVar8 = 8;
          }
          if (local_88 < local_b8 + uVar10) {
            uVar8 = 0;
          }
          if (uVar23 < uVar8 + uVar23) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_0017edc8;
            pUVar2 = ms->hashTable;
            pBVar14 = ms->tagTable;
            uVar21 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (local_bc == 5) {
                uVar19 = *(long *)(local_b8 + uVar10) * -0x30e4432345000000;
LAB_0017ea36:
                uVar24 = (uint)((uVar19 ^ uVar21) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (local_bc == 6) {
                  uVar19 = *(long *)(local_b8 + uVar10) * -0x30e4432340650000;
                  goto LAB_0017ea36;
                }
                uVar24 = (*(int *)(local_b8 + uVar10) * -0x61c8864f ^ (uint)uVar21) >>
                         (0x18U - cVar5 & 0x1f);
              }
              uVar29 = (uVar24 >> 8) << ((byte)local_d4 & 0x1f);
              if (((ulong)(pUVar2 + uVar29) & 0x3f) != 0) goto LAB_0017ecd0;
              if ((local_38 & (ulong)(pBVar14 + uVar29)) != 0) goto LAB_0017ecb1;
              ms->hashCache[(uint)uVar10 & 7] = uVar24;
              uVar10 = uVar10 + 1;
              psVar26 = local_58;
            } while (uVar8 + uVar23 != uVar10);
          }
          ms->lazySkipping = 0;
        }
        piVar30 = (int *)((long)local_a0 + local_c8);
        piVar22 = local_d0;
        uVar10 = local_98;
        local_b0 = piVar30;
        do {
          UVar28 = UVar27;
          if (local_88 < piVar30) break;
          iVar7 = (int)piVar30 - (int)local_b8;
          UVar28 = (ms->window).lowLimit;
          UVar13 = iVar7 - (uint)local_80;
          if (iVar7 - UVar28 <= (uint)local_80) {
            UVar13 = UVar28;
          }
          if (ms->loadedDictEnd != 0) {
            UVar13 = UVar28;
          }
          uVar23 = iVar7 - UVar18;
          pBVar14 = local_b8;
          if (uVar23 < (uint)uVar10) {
            pBVar14 = local_78;
          }
          if (((local_c0 - uVar23 < 3) || (iVar7 - UVar13 < UVar18)) ||
             (*piVar30 != *(int *)(pBVar14 + uVar23))) {
            bVar4 = false;
            UVar28 = UVar18;
          }
          else {
            piVar15 = piVar22;
            if (uVar23 < (uint)uVar10) {
              piVar15 = local_60;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar30 + 1),(BYTE *)((long)(pBVar14 + uVar23) + 4),
                               (BYTE *)piVar22,(BYTE *)piVar15,local_70);
            if (psVar26->maxNbSeq <=
                (ulong)((long)psVar26->sequences - (long)psVar26->sequencesStart >> 3))
            goto LAB_0017ecef;
            if (0x20000 < psVar26->maxNbLit) goto LAB_0017ed0e;
            pBVar14 = psVar26->lit;
            if (psVar26->litStart + psVar26->maxNbLit < pBVar14) goto LAB_0017ed6b;
            if (local_d0 < local_b0) goto LAB_0017ed4c;
            if (local_48 < local_b0) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_b0,(BYTE *)local_b0,(BYTE *)local_48);
            }
            else {
              uVar6 = *(undefined8 *)(local_b0 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)local_b0;
              *(undefined8 *)(pBVar14 + 8) = uVar6;
            }
            psVar3 = psVar26->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_0017ed2d;
            if (0xffff < sVar9 + 1) {
              if (psVar26->longLengthType != ZSTD_llt_none) goto LAB_0017ed8a;
              psVar26->longLengthType = ZSTD_llt_matchLength;
              psVar26->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar26->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(sVar9 + 1);
            psVar26->sequences = psVar3 + 1;
            piVar30 = (int *)((long)piVar30 + sVar9 + 4);
            bVar4 = true;
            piVar22 = local_d0;
            uVar10 = local_98;
            UVar28 = UVar27;
            UVar27 = UVar18;
            local_b0 = piVar30;
          }
          UVar18 = UVar28;
          UVar28 = UVar27;
        } while (bVar4);
      }
    } while (piVar30 < local_88);
  }
  *local_40 = UVar28;
  local_40[1] = UVar18;
  return (long)piVar22 - (long)local_b0;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}